

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RWNode.h
# Opt level: O0

void __thiscall dg::dda::RWNode::RWNode(RWNode *this,RWNodeType t)

{
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  SubgraphNode<dg::dda::RWNode>::SubgraphNode
            ((SubgraphNode<dg::dda::RWNode> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (IDType)((ulong)in_RDI >> 0x20));
  *in_RDI = &PTR__RWNode_001a8cb8;
  *(undefined4 *)(in_RDI + 0x12) = in_ESI;
  *(undefined1 *)((long)in_RDI + 0x94) = 0;
  in_RDI[0x13] = 0;
  Annotations::Annotations((Annotations *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  DefUses::DefUses((DefUses *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return;
}

Assistant:

RWNode(RWNodeType t = RWNodeType::NONE)
            : SubgraphNode<RWNode>(0), type(t) {}